

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NN.cpp
# Opt level: O1

int __thiscall NN::addnode(NN *this,int r,int c,int k)

{
  int iVar1;
  NeuronMat *this_00;
  long *plVar2;
  int iVar3;
  
  this_00 = (NeuronMat *)operator_new(0x48);
  NeuronMat::NeuronMat(this_00,r,c,k);
  iVar1 = this->tot;
  iVar3 = iVar1 + 1;
  this->tot = iVar3;
  (this->neuron).super__Vector_base<NeuronMat_*,_std::allocator<NeuronMat_*>_>._M_impl.
  super__Vector_impl_data._M_start[(long)iVar1 + 1] = this_00;
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return this->tot;
}

Assistant:

int NN::addnode(int r, int c, int k) {
    neuron[++tot] = new NeuronMat(r, c, k);
    cout<<tot<<endl;
    return tot;
}